

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,SignedType type)

{
  char *src;
  
  if (type.type.enum_ == I32) {
    src = "s32";
  }
  else {
    if (type.type.enum_ != I64) {
      abort();
    }
    src = "s64";
  }
  WriteData(this,src,3);
  return;
}

Assistant:

void CWriter::Write(SignedType type) {
  // clang-format off
  switch (type.type) {
    case Type::I32: Write("s32"); break;
    case Type::I64: Write("s64"); break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}